

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_monster_name(parser *p)

{
  void *pvVar1;
  undefined8 *v;
  char *pcVar2;
  monster_race *r;
  monster_race *h;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  v = (undefined8 *)mem_zalloc(0xd0);
  *v = pvVar1;
  pcVar2 = parser_getstr(p,"name");
  pcVar2 = string_make(pcVar2);
  v[2] = pcVar2;
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_monster_name(struct parser *p) {
	struct monster_race *h = parser_priv(p);
	struct monster_race *r = mem_zalloc(sizeof *r);
	r->next = h;
	r->name = string_make(parser_getstr(p, "name"));
	parser_setpriv(p, r);
	return PARSE_ERROR_NONE;
}